

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_compute_fluxes_from_state.cpp
# Opt level: O3

void HydroUtils::ComputeFluxesOnBoxFromState
               (Box *bx,int ncomp,MFIter *mfi,Array4<const_double> *q,Array4<double> *flux_x,
               Array4<double> *flux_y,Array4<double> *flux_z,Array4<double> *face_x,
               Array4<double> *face_y,Array4<double> *face_z,bool knownFaceState,
               Array4<const_double> *u_mac,Array4<const_double> *v_mac,Array4<const_double> *w_mac,
               Array4<const_double> *divu,Array4<const_double> *fq,Geometry geom,Real l_dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec,
               int *iconserv,EBFArrayBoxFactory *ebfact,bool godunov_use_ppm,
               bool godunov_use_forces_in_trans,bool is_velocity,bool fluxes_are_area_weighted,
               string *advection_type)

{
  long lVar1;
  Geometry *pGVar2;
  undefined8 *puVar3;
  Geometry in_stack_fffffffffffffe68;
  Array4<const_double> local_78;
  
  local_78.kstride = 0;
  local_78.nstride = 0;
  local_78.p = (double *)0x0;
  local_78.jstride = 0;
  local_78.begin.x = 1;
  local_78.begin.y = 1;
  local_78.begin.z = 1;
  local_78.end.x = 0;
  local_78.end.y = 0;
  local_78.end.z = 0;
  local_78.ncomp = 0;
  pGVar2 = &geom;
  puVar3 = (undefined8 *)&stack0xfffffffffffffe68;
  for (lVar1 = 0x19; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)&pGVar2->super_CoordSys;
    pGVar2 = (Geometry *)(pGVar2->super_CoordSys).offset;
    puVar3 = puVar3 + 1;
  }
  ComputeFluxesOnBoxFromState
            (bx,ncomp,mfi,q,flux_x,flux_y,flux_z,face_x,face_y,face_z,knownFaceState,u_mac,v_mac,
             w_mac,divu,fq,in_stack_fffffffffffffe68,l_dt,h_bcrec,d_bcrec,iconserv,ebfact,&local_78,
             godunov_use_ppm,godunov_use_forces_in_trans,is_velocity,fluxes_are_area_weighted,
             advection_type);
  return;
}

Assistant:

void
HydroUtils::ComputeFluxesOnBoxFromState (Box const& bx, int ncomp, MFIter& mfi,
                                         Array4<Real const> const& q,
                                         AMREX_D_DECL(Array4<Real> const& flux_x,
                                                      Array4<Real> const& flux_y,
                                                      Array4<Real> const& flux_z),
                                         AMREX_D_DECL(Array4<Real> const& face_x,
                                                      Array4<Real> const& face_y,
                                                      Array4<Real> const& face_z),
                                         bool knownFaceState,
                                         AMREX_D_DECL(Array4<Real const> const& u_mac,
                                                      Array4<Real const> const& v_mac,
                                                      Array4<Real const> const& w_mac),
                                         Array4<Real const> const& divu,
                                         Array4<Real const> const& fq,
                                         Geometry geom, Real l_dt,
                                         Vector<BCRec> const& h_bcrec,
                                         const BCRec* d_bcrec,
                                         int const* iconserv,
                                         const EBFArrayBoxFactory& ebfact,
                                         bool godunov_use_ppm, bool godunov_use_forces_in_trans,
                                         bool is_velocity, bool fluxes_are_area_weighted,
                                         std::string& advection_type)

{
    ComputeFluxesOnBoxFromState(bx, ncomp, mfi, q,
                                AMREX_D_DECL(flux_x, flux_y, flux_z),
                                AMREX_D_DECL(face_x, face_y, face_z),
                                knownFaceState,
                                AMREX_D_DECL(u_mac, v_mac, w_mac),
                                divu, fq, geom, l_dt, h_bcrec, d_bcrec, iconserv,
                                ebfact, /*values_on_eb_inflow*/ Array4<Real const>{},
                                godunov_use_ppm, godunov_use_forces_in_trans,
                                is_velocity, fluxes_are_area_weighted, advection_type);

}